

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O3

void __thiscall
QSequentialAnimationGroupPrivate::animationRemoved
          (QSequentialAnimationGroupPrivate *this,qsizetype index,QAbstractAnimation *anim)

{
  QBindingStorage *this_00;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *data;
  int iVar1;
  QObject *pQVar2;
  QBindingStatus *pQVar3;
  int iVar4;
  parameter_type pVar5;
  int iVar6;
  qsizetype qVar7;
  ulong uVar8;
  
  pQVar2 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.q_ptr;
  QAnimationGroupPrivate::animationRemoved(&this->super_QAnimationGroupPrivate,index,anim);
  data = &this->currentAnimation;
  this_00 = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage;
  pQVar3 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar3 != (QBindingStatus *)0x0) &&
     (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
  }
  if ((data->super_QPropertyData<QAbstractAnimation_*>).val == (QAbstractAnimation *)0x0) {
    return;
  }
  if (index < (this->actualDuration).d.size) {
    QList<int>::removeAt(&this->actualDuration,index);
  }
  qVar7 = QtPrivate::
          indexOf<QAbstractAnimation_*,_QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>_>
                    (&(this->super_QAnimationGroupPrivate).animations,data,0);
  if (qVar7 != -1) {
    if (index < this->currentAnimationIndex) {
      this->currentAnimationIndex = this->currentAnimationIndex + -1;
    }
    goto LAB_003af188;
  }
  pQVar3 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar3 != (QBindingStatus *)0x0) &&
     (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
  }
  QObject::disconnect(&((this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val)->
                       super_QObject,(char *)0x0,
                      (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                      super_QObjectPrivate.super_QObjectData.q_ptr,
                      "1_q_uncontrolledAnimationFinished()");
  if (index < (this->super_QAnimationGroupPrivate).animations.d.size) {
LAB_003af17c:
    iVar4 = (int)index;
  }
  else {
    if (index != 0) {
      index = (qsizetype)((int)index - 1);
      goto LAB_003af17c;
    }
    iVar4 = -1;
  }
  setCurrentAnimation(this,iVar4,false);
LAB_003af188:
  (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime = 0;
  if (this->currentAnimationIndex < 1) {
    iVar4 = 0;
  }
  else {
    uVar8 = 0;
    do {
      iVar4 = QAbstractAnimation::totalDuration
                        ((QAbstractAnimation *)
                         (this->super_QAnimationGroupPrivate).animations.d.ptr[uVar8]);
      if ((iVar4 == -1) && (iVar4 = -1, uVar8 < (ulong)(this->actualDuration).d.size)) {
        iVar4 = (this->actualDuration).d.ptr[uVar8];
      }
      iVar4 = iVar4 + (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                      currentTime;
      (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime = iVar4;
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)this->currentAnimationIndex);
  }
  if (qVar7 != -1) {
    pQVar3 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
    if ((pQVar3 != (QBindingStatus *)0x0) &&
       (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
    }
    pVar5 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
            ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                     *)&(((this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val)->
                        super_QObject).d_ptr.d[1].field_0x30);
    iVar4 = pVar5 + (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime
    ;
    (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime = iVar4;
  }
  pQVar3 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar3 != (QBindingStatus *)0x0) &&
     (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper
              (this_00,(QUntypedPropertyData *)
                       &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                        loopCount);
  }
  iVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.loopCount.
          super_QPropertyData<int>.val;
  iVar6 = (*pQVar2->_vptr_QObject[0xc])(pQVar2);
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
  ::setValue(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.totalCurrentTime,
             iVar1 * iVar6 + iVar4);
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::animationRemoved(qsizetype index, QAbstractAnimation *anim)
{
    Q_Q(QSequentialAnimationGroup);
    QAnimationGroupPrivate::animationRemoved(index, anim);

    if (!currentAnimation)
        return;

    if (actualDuration.size() > index)
        actualDuration.removeAt(index);

    const qsizetype currentIndex = animations.indexOf(currentAnimation);
    if (currentIndex == -1) {
        //we're removing the current animation

        disconnectUncontrolledAnimation(currentAnimation);

        if (index < animations.size())
            setCurrentAnimation(index); //let's try to take the next one
        else if (index > 0)
            setCurrentAnimation(index - 1);
        else// case all animations were removed
            setCurrentAnimation(-1);
    } else if (currentAnimationIndex > index) {
        currentAnimationIndex--;
    }

    // duration of the previous animations up to the current animation
    currentTime = 0;
    for (qsizetype i = 0; i < currentAnimationIndex; ++i) {
        const int current = animationActualTotalDuration(i);
        currentTime += current;
    }

    if (currentIndex != -1) {
        //the current animation is not the one being removed
        //so we add its current time to the current time of this group
        currentTime += QAbstractAnimationPrivate::get(currentAnimation)->totalCurrentTime;
    }

    //let's also update the total current time
    totalCurrentTime = currentTime + loopCount * q->duration();
}